

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

void Lms_ManPrint(Lms_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  double local_130;
  double local_120;
  double local_110;
  double local_100;
  double local_f0;
  double local_e0;
  double local_d0;
  double local_c0;
  double local_b0;
  double local_a0;
  double local_90;
  double local_80;
  double local_70;
  double local_60;
  double local_50;
  double local_40;
  double local_30;
  uint local_20;
  Lms_Man_t *p_local;
  
  uVar1 = p->nVars;
  uVar3 = Vec_MemEntryNum(p->vTtMem);
  uVar2 = p->nAdded;
  if (p->pGia == (Gia_Man_t *)0x0) {
    local_20 = 0;
  }
  else {
    local_20 = Gia_ManAndNum(p->pGia);
  }
  printf("Library with %d vars has %d classes and %d AIG subgraphs with %d AND nodes.\n",
         (ulong)uVar1,(ulong)uVar3,(ulong)uVar2,(ulong)local_20);
  Lms_ManPrintFuncStats(p);
  iVar4 = Vec_MemEntryNum(p->vTtMem);
  p->nAddedFuncs = iVar4;
  if (p->nTried == 0) {
    local_30 = 0.0;
  }
  else {
    local_30 = ((double)p->nTried * 100.0) / (double)p->nTried;
  }
  printf("Subgraphs tried                             = %10d. (%6.2f %%)\n",local_30,
         (ulong)(uint)p->nTried);
  if (p->nTried == 0) {
    local_40 = 0.0;
  }
  else {
    local_40 = ((double)p->nFilterSize * 100.0) / (double)p->nTried;
  }
  printf("Subgraphs filtered by support size          = %10d. (%6.2f %%)\n",local_40,
         (ulong)(uint)p->nFilterSize);
  if (p->nTried == 0) {
    local_50 = 0.0;
  }
  else {
    local_50 = ((double)p->nFilterRedund * 100.0) / (double)p->nTried;
  }
  printf("Subgraphs filtered by structural redundancy = %10d. (%6.2f %%)\n",local_50,
         (ulong)(uint)p->nFilterRedund);
  if (p->nTried == 0) {
    local_60 = 0.0;
  }
  else {
    local_60 = ((double)p->nFilterVolume * 100.0) / (double)p->nTried;
  }
  printf("Subgraphs filtered by volume                = %10d. (%6.2f %%)\n",local_60,
         (ulong)(uint)p->nFilterVolume);
  if (p->nTried == 0) {
    local_70 = 0.0;
  }
  else {
    local_70 = ((double)p->nFilterTruth * 100.0) / (double)p->nTried;
  }
  printf("Subgraphs filtered by TT redundancy         = %10d. (%6.2f %%)\n",local_70,
         (ulong)(uint)p->nFilterTruth);
  if (p->nTried == 0) {
    local_80 = 0.0;
  }
  else {
    local_80 = ((double)p->nFilterError * 100.0) / (double)p->nTried;
  }
  printf("Subgraphs filtered by error                 = %10d. (%6.2f %%)\n",local_80,
         (ulong)(uint)p->nFilterError);
  if (p->nTried == 0) {
    local_90 = 0.0;
  }
  else {
    local_90 = ((double)p->nFilterSame * 100.0) / (double)p->nTried;
  }
  printf("Subgraphs filtered by isomorphism           = %10d. (%6.2f %%)\n",local_90,
         (ulong)(uint)p->nFilterSame);
  if (p->nTried == 0) {
    local_a0 = 0.0;
  }
  else {
    local_a0 = ((double)p->nAdded * 100.0) / (double)p->nTried;
  }
  printf("Subgraphs added                             = %10d. (%6.2f %%)\n",local_a0,
         (ulong)(uint)p->nAdded);
  if (p->nTried == 0) {
    local_b0 = 0.0;
  }
  else {
    local_b0 = ((double)p->nAddedFuncs * 100.0) / (double)p->nTried;
  }
  printf("Functions added                             = %10d. (%6.2f %%)\n",local_b0,
         (ulong)(uint)p->nAddedFuncs);
  if (p->nHoleInTheWall != 0) {
    if (p->nTried == 0) {
      local_c0 = 0.0;
    }
    else {
      local_c0 = ((double)p->nHoleInTheWall * 100.0) / (double)p->nTried;
    }
    printf("Cuts whose logic structure has a hole       = %10d. (%6.2f %%)\n",local_c0,
           (ulong)(uint)p->nHoleInTheWall);
  }
  p->timeOther = ((((p->timeTotal - p->timeTruth) - p->timeCanon) - p->timeBuild) - p->timeCheck) -
                 p->timeInsert;
  Abc_Print(1,"%s =","Runtime: Truth ");
  if (p->timeTotal == 0) {
    local_d0 = 0.0;
  }
  else {
    local_d0 = ((double)p->timeTruth * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeTruth * 1.0) / 1000000.0,local_d0);
  Abc_Print(1,"%s =","Runtime: Canon ");
  if (p->timeTotal == 0) {
    local_e0 = 0.0;
  }
  else {
    local_e0 = ((double)p->timeCanon * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeCanon * 1.0) / 1000000.0,local_e0);
  Abc_Print(1,"%s =","Runtime: Build ");
  if (p->timeTotal == 0) {
    local_f0 = 0.0;
  }
  else {
    local_f0 = ((double)p->timeBuild * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeBuild * 1.0) / 1000000.0,local_f0);
  Abc_Print(1,"%s =","Runtime: Check ");
  if (p->timeTotal == 0) {
    local_100 = 0.0;
  }
  else {
    local_100 = ((double)p->timeCheck * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeCheck * 1.0) / 1000000.0,local_100);
  Abc_Print(1,"%s =","Runtime: Insert");
  if (p->timeTotal == 0) {
    local_110 = 0.0;
  }
  else {
    local_110 = ((double)p->timeInsert * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeInsert * 1.0) / 1000000.0,local_110);
  Abc_Print(1,"%s =","Runtime: Other ");
  if (p->timeTotal == 0) {
    local_120 = 0.0;
  }
  else {
    local_120 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeOther * 1.0) / 1000000.0,local_120);
  Abc_Print(1,"%s =","Runtime: TOTAL ");
  if (p->timeTotal == 0) {
    local_130 = 0.0;
  }
  else {
    local_130 = ((double)p->timeTotal * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeTotal * 1.0) / 1000000.0,local_130);
  return;
}

Assistant:

void Lms_ManPrint( Lms_Man_t * p )
{
//    Gia_ManPrintStats( p->pGia, 0, 0 );
    printf( "Library with %d vars has %d classes and %d AIG subgraphs with %d AND nodes.\n", 
        p->nVars, Vec_MemEntryNum(p->vTtMem), p->nAdded, p->pGia ? Gia_ManAndNum(p->pGia) : 0 );

//    Lms_ManPrintFreqStats( p );
    Lms_ManPrintFuncStats( p );

    p->nAddedFuncs = Vec_MemEntryNum(p->vTtMem);
    printf( "Subgraphs tried                             = %10d. (%6.2f %%)\n", p->nTried,         !p->nTried? 0 : 100.0*p->nTried/p->nTried );
    printf( "Subgraphs filtered by support size          = %10d. (%6.2f %%)\n", p->nFilterSize,    !p->nTried? 0 : 100.0*p->nFilterSize/p->nTried );
    printf( "Subgraphs filtered by structural redundancy = %10d. (%6.2f %%)\n", p->nFilterRedund,  !p->nTried? 0 : 100.0*p->nFilterRedund/p->nTried );
    printf( "Subgraphs filtered by volume                = %10d. (%6.2f %%)\n", p->nFilterVolume,  !p->nTried? 0 : 100.0*p->nFilterVolume/p->nTried );
    printf( "Subgraphs filtered by TT redundancy         = %10d. (%6.2f %%)\n", p->nFilterTruth,   !p->nTried? 0 : 100.0*p->nFilterTruth/p->nTried );
    printf( "Subgraphs filtered by error                 = %10d. (%6.2f %%)\n", p->nFilterError,   !p->nTried? 0 : 100.0*p->nFilterError/p->nTried );
    printf( "Subgraphs filtered by isomorphism           = %10d. (%6.2f %%)\n", p->nFilterSame,    !p->nTried? 0 : 100.0*p->nFilterSame/p->nTried );
    printf( "Subgraphs added                             = %10d. (%6.2f %%)\n", p->nAdded,         !p->nTried? 0 : 100.0*p->nAdded/p->nTried );
    printf( "Functions added                             = %10d. (%6.2f %%)\n", p->nAddedFuncs,    !p->nTried? 0 : 100.0*p->nAddedFuncs/p->nTried );
    if ( p->nHoleInTheWall )
    printf( "Cuts whose logic structure has a hole       = %10d. (%6.2f %%)\n", p->nHoleInTheWall, !p->nTried? 0 : 100.0*p->nHoleInTheWall/p->nTried );

    p->timeOther = p->timeTotal - p->timeTruth - p->timeCanon - p->timeBuild - p->timeCheck - p->timeInsert;
    ABC_PRTP( "Runtime: Truth ", p->timeTruth,  p->timeTotal );
    ABC_PRTP( "Runtime: Canon ", p->timeCanon,  p->timeTotal );
    ABC_PRTP( "Runtime: Build ", p->timeBuild,  p->timeTotal );
    ABC_PRTP( "Runtime: Check ", p->timeCheck,  p->timeTotal );
    ABC_PRTP( "Runtime: Insert", p->timeInsert, p->timeTotal );
    ABC_PRTP( "Runtime: Other ", p->timeOther,  p->timeTotal );
    ABC_PRTP( "Runtime: TOTAL ", p->timeTotal,  p->timeTotal );
}